

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse2_128_8.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse2_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  uint uVar12;
  void *pvVar13;
  parasail_matrix_t *ppVar14;
  int *piVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  char cVar20;
  byte bVar21;
  byte bVar22;
  uint uVar23;
  int iVar24;
  parasail_result_t *ppVar25;
  __m128i *ptr;
  int8_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *palVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  ulong size;
  int iVar32;
  uint uVar33;
  int iVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  ushort uVar38;
  int iVar39;
  long lVar40;
  ulong uVar41;
  byte bVar42;
  undefined4 uVar43;
  ulong uVar48;
  undefined1 uVar65;
  undefined1 uVar66;
  undefined1 uVar67;
  undefined1 auVar49 [16];
  undefined4 uVar44;
  undefined1 auVar50 [16];
  undefined4 uVar45;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar46;
  undefined4 uVar47;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar71;
  byte bVar79;
  int iVar80;
  byte bVar81;
  int iVar82;
  byte bVar83;
  int iVar84;
  undefined1 auVar72 [16];
  __m128i alVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  int iVar102;
  int iVar105;
  int iVar106;
  undefined1 auVar103 [16];
  int iVar107;
  ushort uVar108;
  undefined1 auVar104 [16];
  int iVar117;
  undefined1 in_XMM9 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  int iVar118;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  __m128i_8_t e;
  __m128i_8_t h;
  long local_170;
  int local_168;
  char local_158;
  char cStack_157;
  char cStack_156;
  char cStack_155;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  char cVar133;
  char cVar139;
  char cVar140;
  char cVar141;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_scan_profile_sse2_128_8_cold_8();
  }
  else {
    pvVar13 = (profile->profile8).score;
    if (pvVar13 == (void *)0x0) {
      parasail_sg_flags_table_scan_profile_sse2_128_8_cold_7();
    }
    else {
      ppVar14 = profile->matrix;
      if (ppVar14 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_scan_profile_sse2_128_8_cold_6();
      }
      else {
        uVar12 = profile->s1Len;
        if ((int)uVar12 < 1) {
          parasail_sg_flags_table_scan_profile_sse2_128_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_scan_profile_sse2_128_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_scan_profile_sse2_128_8_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_scan_profile_sse2_128_8_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_scan_profile_sse2_128_8_cold_1();
        }
        else {
          uVar23 = uVar12 - 1;
          uVar31 = (ulong)uVar12 + 0xf;
          size = uVar31 >> 4;
          uVar48 = (ulong)uVar23 % size;
          iVar24 = (int)(uVar23 / size);
          iVar32 = -open;
          iVar27 = ppVar14->min;
          uVar46 = (uint)(byte)-(char)iVar27;
          if (iVar27 != iVar32 && SBORROW4(iVar27,iVar32) == iVar27 + open < 0) {
            uVar46 = open;
          }
          cVar20 = '~' - (char)ppVar14->max;
          ppVar25 = parasail_result_new_table1((uint)uVar31 & 0x7ffffff0,s2Len);
          if (ppVar25 != (parasail_result_t *)0x0) {
            iVar27 = (uint)(s1_end != 0) * 0x10;
            ppVar25->flag =
                 iVar27 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar25->flag | 0x10120402;
            ptr = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,size);
            ptr_02 = parasail_memalign___m128i(0x10,size);
            ptr_03 = parasail_memalign___m128i(0x10,size);
            auVar49._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
            auVar49._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
            auVar49._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
            auVar49._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
            iVar27 = movmskps(iVar27,auVar49);
            if (iVar27 != 0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_03 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            iVar27 = s2Len + -1;
            iVar28 = 0xf - iVar24;
            uVar67 = (undefined1)((uint)open >> 0x18);
            uVar66 = (undefined1)((uint)open >> 0x10);
            uVar65 = (undefined1)((uint)open >> 8);
            auVar50._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar67,uVar67),uVar66),CONCAT14(uVar66,open)) >>
                      0x20);
            auVar50[3] = uVar65;
            auVar50[2] = uVar65;
            auVar50[0] = (undefined1)open;
            auVar50[1] = auVar50[0];
            auVar50._8_8_ = 0;
            auVar49 = pshuflw(auVar50,auVar50,0);
            uVar43 = auVar49._0_4_;
            auVar70._4_4_ = uVar43;
            auVar70._0_4_ = uVar43;
            auVar70._8_4_ = uVar43;
            auVar70._12_4_ = uVar43;
            uVar65 = (undefined1)((uint)gap >> 0x10);
            uVar67 = (undefined1)((uint)gap >> 0x18);
            uVar66 = (undefined1)((uint)gap >> 8);
            auVar52._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar67,uVar67),uVar65),CONCAT14(uVar65,gap)) >>
                      0x20);
            auVar52[3] = uVar66;
            auVar52[2] = uVar66;
            auVar52[0] = (char)gap;
            auVar52[1] = auVar52[0];
            auVar52._8_8_ = 0;
            auVar49 = pshuflw(auVar52,auVar52,0);
            uVar43 = auVar49._0_4_;
            bVar42 = (char)uVar46 + 0x81;
            uVar38 = (ushort)bVar42;
            auVar49 = pshuflw(ZEXT216(CONCAT11(bVar42,bVar42)),ZEXT216(CONCAT11(bVar42,bVar42)),0);
            uVar44 = auVar49._0_4_;
            auVar50 = ZEXT216(CONCAT11(cVar20,cVar20));
            auVar50 = pshuflw(auVar50,auVar50,0);
            uVar45 = auVar50._0_4_;
            uVar67 = (undefined1)((uint)iVar28 >> 0x18);
            uVar66 = (undefined1)((uint)iVar28 >> 0x10);
            uVar65 = (undefined1)((uint)iVar28 >> 8);
            auVar51._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar67,uVar67),uVar66),CONCAT14(uVar66,iVar28)) >>
                      0x20);
            auVar51[3] = uVar65;
            auVar51[2] = uVar65;
            auVar51[0] = (undefined1)iVar28;
            auVar51[1] = auVar51[0];
            auVar51._8_8_ = 0;
            auVar51 = pshuflw(auVar51,auVar51,0);
            local_158 = auVar51[0];
            cStack_157 = auVar51[1];
            cStack_156 = auVar51[2];
            cStack_155 = auVar51[3];
            cVar20 = -((char)size * auVar52[0]);
            auVar52 = ZEXT216(CONCAT11(cVar20,cVar20));
            auVar52 = pshuflw(auVar52,auVar52,0);
            uVar46 = auVar52._0_4_;
            auVar53._0_8_ = CONCAT44(uVar46,uVar46);
            auVar53._8_4_ = uVar46;
            auVar53._12_4_ = uVar46;
            auVar103._0_8_ = auVar53._0_8_ << 8;
            auVar103._8_8_ = auVar53._8_8_ << 8 | (ulong)(uVar46 >> 0x18);
            auVar52 = paddsb(auVar103,ZEXT116(bVar42));
            lVar30 = (long)iVar32;
            uVar35 = 0;
            do {
              lVar37 = 0;
              lVar36 = lVar30;
              do {
                lVar40 = lVar36;
                if (s1_beg != 0) {
                  lVar40 = 0;
                }
                uVar65 = 0x80;
                if (-0x80 < lVar40) {
                  uVar65 = (undefined1)lVar40;
                }
                *(undefined1 *)((long)&local_48 + lVar37) = uVar65;
                lVar40 = lVar40 - (ulong)(uint)open;
                if (lVar40 < -0x7f) {
                  lVar40 = -0x80;
                }
                *(char *)((long)&local_58 + lVar37) = (char)lVar40;
                lVar37 = lVar37 + 1;
                lVar36 = lVar36 - size * (uint)gap;
              } while (lVar37 != 0x10);
              ptr_02[uVar35][0] = local_48;
              ptr_02[uVar35][1] = lStack_40;
              ptr[uVar35][0] = local_58;
              ptr[uVar35][1] = lStack_50;
              uVar35 = uVar35 + 1;
              lVar30 = lVar30 - (ulong)(uint)gap;
            } while (uVar35 != size);
            *ptr_00 = '\0';
            auVar51 = _DAT_00903aa0;
            uVar35 = (ulong)(uint)s2Len;
            lVar30 = uVar35 - 1;
            auVar74._8_4_ = (int)lVar30;
            auVar74._0_8_ = lVar30;
            auVar74._12_4_ = (int)((ulong)lVar30 >> 0x20);
            auVar124._4_4_ = iVar32;
            auVar124._0_4_ = iVar32;
            auVar124._8_4_ = iVar32;
            auVar124._12_4_ = iVar32;
            iVar34 = -gap;
            auVar127._8_4_ = 0xffffffff;
            auVar127._0_8_ = 0xffffffffffffffff;
            auVar127._12_4_ = 0xffffffff;
            iVar39 = 0;
            uVar41 = 0;
            do {
              uVar47 = (undefined4)uVar41;
              auVar131._8_4_ = uVar47;
              auVar131._0_8_ = uVar41;
              auVar131._12_4_ = (int)(uVar41 >> 0x20);
              auVar103 = auVar74 ^ auVar51;
              auVar53 = (auVar131 | _DAT_00903a90) ^ auVar51;
              iVar102 = auVar103._0_4_;
              iVar71 = -(uint)(iVar102 < auVar53._0_4_);
              iVar105 = auVar103._4_4_;
              iVar80 = -(uint)(iVar105 < auVar53._4_4_);
              iVar106 = auVar103._8_4_;
              iVar82 = -(uint)(iVar106 < auVar53._8_4_);
              iVar107 = auVar103._12_4_;
              iVar84 = -(uint)(iVar107 < auVar53._12_4_);
              auVar93._4_4_ = iVar71;
              auVar93._0_4_ = iVar71;
              auVar93._8_4_ = iVar82;
              auVar93._12_4_ = iVar82;
              auVar103 = pshuflw(in_XMM9,auVar93,0xe8);
              auVar109._0_4_ = -(uint)(auVar53._0_4_ == iVar102);
              auVar109._4_4_ = -(uint)(auVar53._4_4_ == iVar105);
              auVar109._8_4_ = -(uint)(auVar53._8_4_ == iVar106);
              auVar109._12_4_ = -(uint)(auVar53._12_4_ == iVar107);
              auVar121._4_4_ = auVar109._4_4_;
              auVar121._0_4_ = auVar109._4_4_;
              auVar121._8_4_ = auVar109._12_4_;
              auVar121._12_4_ = auVar109._12_4_;
              auVar53 = pshuflw(auVar109,auVar121,0xe8);
              auVar85._4_4_ = iVar80;
              auVar85._0_4_ = iVar80;
              auVar85._8_4_ = iVar84;
              auVar85._12_4_ = iVar84;
              auVar109 = pshuflw(auVar103,auVar85,0xe8);
              auVar53 = (auVar109 | auVar53 & auVar103) ^ auVar127;
              auVar53 = packssdw(auVar53,auVar53);
              iVar71 = iVar32 - (gap * 2 + iVar39);
              iVar80 = iVar32 - (gap * 3 + iVar39);
              bVar22 = -(-0x80 < iVar32 - iVar39);
              bVar79 = -(-0x80 < iVar34 - open);
              bVar81 = -(-0x80 < iVar71);
              bVar83 = -(-0x80 < iVar80);
              bVar21 = 0;
              if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                bVar22 = ~bVar22 & 0x80 | (byte)(iVar32 - iVar39) & bVar22;
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 1] = bVar22;
              }
              auVar85 = auVar121 & auVar93 | auVar85;
              auVar53 = packssdw(auVar85,auVar85);
              auVar53 = packssdw(auVar53 ^ auVar127,auVar53 ^ auVar127);
              auVar53 = packsswb(auVar53,auVar53);
              if ((auVar53._0_4_ >> 8 & 1) != 0) {
                bVar22 = ~bVar79 & 0x80 | (byte)(iVar34 - open) & bVar79;
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 2] = bVar22;
              }
              auVar53 = (auVar131 | _DAT_00903a80) ^ auVar51;
              iVar82 = -(uint)(iVar102 < auVar53._0_4_);
              auVar110._4_4_ = -(uint)(iVar105 < auVar53._4_4_);
              iVar84 = -(uint)(iVar106 < auVar53._8_4_);
              auVar110._12_4_ = -(uint)(iVar107 < auVar53._12_4_);
              auVar86._4_4_ = iVar82;
              auVar86._0_4_ = iVar82;
              auVar86._8_4_ = iVar84;
              auVar86._12_4_ = iVar84;
              iVar82 = -(uint)(auVar53._4_4_ == iVar105);
              iVar84 = -(uint)(auVar53._12_4_ == iVar107);
              auVar94._4_4_ = iVar82;
              auVar94._0_4_ = iVar82;
              auVar94._8_4_ = iVar84;
              auVar94._12_4_ = iVar84;
              auVar110._0_4_ = auVar110._4_4_;
              auVar110._8_4_ = auVar110._12_4_;
              auVar53 = auVar94 & auVar86 | auVar110;
              auVar53 = packssdw(auVar53,auVar53);
              auVar53 = packssdw(auVar53 ^ auVar127,auVar53 ^ auVar127);
              auVar53 = packsswb(auVar53,auVar53);
              if ((auVar53._0_4_ >> 0x10 & 1) != 0) {
                bVar22 = ~bVar81 & 0x80 | (byte)iVar71 & bVar81;
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 3] = bVar22;
              }
              auVar53 = pshufhw(auVar53,auVar86,0x84);
              auVar109 = pshufhw(auVar86,auVar94,0x84);
              auVar103 = pshufhw(auVar53,auVar110,0x84);
              auVar53 = (auVar103 | auVar109 & auVar53) ^ auVar127;
              auVar53 = packssdw(auVar53,auVar53);
              auVar53 = packsswb(auVar53,auVar53);
              if ((auVar53._0_4_ >> 0x18 & 1) != 0) {
                bVar22 = ~bVar83 & 0x80 | (byte)iVar80 & bVar83;
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 4] = bVar22;
              }
              auVar72._4_4_ = uVar47;
              auVar72._0_4_ = uVar47;
              auVar72._8_4_ = uVar47;
              auVar72._12_4_ = uVar47;
              auVar53 = auVar72 | _DAT_00904a90;
              iVar71 = auVar53._4_4_;
              auVar95._4_4_ = iVar71;
              auVar95._0_4_ = iVar71;
              auVar95._8_4_ = auVar53._12_4_;
              auVar95._12_4_ = auVar53._12_4_;
              auVar119._0_4_ = iVar32 - auVar53._0_4_ * gap;
              auVar119._4_4_ = iVar32 - iVar71 * gap;
              auVar119._8_4_ = iVar32 - (int)((auVar53._8_8_ & 0xffffffff) * (ulong)(uint)gap);
              auVar119._12_4_ = iVar32 - (int)((auVar95._8_8_ & 0xffffffff) * (ulong)(uint)gap);
              auVar96._0_4_ = -(uint)((int)DAT_00904ba0 < auVar119._0_4_);
              auVar96._4_4_ = -(uint)(DAT_00904ba0._4_4_ < auVar119._4_4_);
              auVar96._8_4_ = -(uint)(DAT_00904ba0._8_4_ < auVar119._8_4_);
              auVar96._12_4_ = -(uint)(DAT_00904ba0._12_4_ < auVar119._12_4_);
              auVar53 = ~auVar96 & _DAT_00904ba0 | auVar119 & auVar96;
              auVar103 = (auVar131 | _DAT_00903ad0) ^ auVar51;
              iVar71 = -(uint)(iVar102 < auVar103._0_4_);
              auVar54._4_4_ = -(uint)(iVar105 < auVar103._4_4_);
              iVar80 = -(uint)(iVar106 < auVar103._8_4_);
              auVar54._12_4_ = -(uint)(iVar107 < auVar103._12_4_);
              auVar134._4_4_ = iVar71;
              auVar134._0_4_ = iVar71;
              auVar134._8_4_ = iVar80;
              auVar134._12_4_ = iVar80;
              auVar109 = pshuflw(auVar119 & auVar96,auVar134,0xe8);
              auVar111._4_4_ = -(uint)(auVar103._4_4_ == iVar105);
              auVar111._12_4_ = -(uint)(auVar103._12_4_ == iVar107);
              auVar111._0_4_ = auVar111._4_4_;
              auVar111._8_4_ = auVar111._12_4_;
              auVar127 = pshuflw(auVar127,auVar111,0xe8);
              auVar54._0_4_ = auVar54._4_4_;
              auVar54._8_4_ = auVar54._12_4_;
              auVar103 = pshuflw(auVar109,auVar54,0xe8);
              auVar56._8_4_ = 0xffffffff;
              auVar56._0_8_ = 0xffffffffffffffff;
              auVar56._12_4_ = 0xffffffff;
              auVar103 = (auVar103 | auVar127 & auVar109) ^ auVar56;
              auVar103 = packssdw(auVar103,auVar103);
              auVar103 = packsswb(auVar103,auVar103);
              if ((auVar103 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                bVar22 = auVar53[0];
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 5] = bVar22;
              }
              auVar103 = auVar111 & auVar134 | auVar54;
              auVar103 = packssdw(auVar103,auVar103);
              auVar103 = packssdw(auVar54,auVar103 ^ auVar56);
              auVar103 = packsswb(auVar103,auVar103);
              if ((auVar103._4_2_ >> 8 & 1) != 0) {
                bVar22 = auVar53[4];
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 6] = bVar22;
              }
              auVar103 = (auVar131 | _DAT_00903ac0) ^ auVar51;
              auVar120._0_4_ = -(uint)(iVar102 < auVar103._0_4_);
              auVar120._4_4_ = -(uint)(iVar105 < auVar103._4_4_);
              auVar120._8_4_ = -(uint)(iVar106 < auVar103._8_4_);
              auVar120._12_4_ = -(uint)(iVar107 < auVar103._12_4_);
              auVar112._4_4_ = auVar120._0_4_;
              auVar112._0_4_ = auVar120._0_4_;
              auVar112._8_4_ = auVar120._8_4_;
              auVar112._12_4_ = auVar120._8_4_;
              iVar71 = -(uint)(auVar103._4_4_ == iVar105);
              iVar80 = -(uint)(auVar103._12_4_ == iVar107);
              auVar135._4_4_ = iVar71;
              auVar135._0_4_ = iVar71;
              auVar135._8_4_ = iVar80;
              auVar135._12_4_ = iVar80;
              auVar55._4_4_ = auVar120._4_4_;
              auVar55._0_4_ = auVar120._4_4_;
              auVar55._8_4_ = auVar120._12_4_;
              auVar55._12_4_ = auVar120._12_4_;
              auVar127 = auVar135 & auVar112 | auVar55;
              auVar103 = packssdw(auVar120,auVar127);
              auVar103 = packssdw(auVar103 ^ auVar56,auVar103 ^ auVar56);
              auVar103 = packsswb(auVar103,auVar103);
              if ((auVar103 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                bVar22 = auVar53[8];
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 7] = bVar22;
              }
              auVar109 = pshufhw(auVar112,auVar112,0x84);
              auVar121 = pshufhw(auVar103,auVar135,0x84);
              auVar103 = pshufhw(auVar55,auVar55,0x84);
              auVar56 = (auVar103 | auVar121 & auVar109) ^ auVar56;
              auVar103 = packssdw(auVar56,auVar56);
              auVar103 = packsswb(auVar103,auVar103);
              if ((auVar103._6_2_ >> 8 & 1) != 0) {
                bVar22 = auVar53[0xc];
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 8] = bVar22;
              }
              auVar53 = auVar72 | _DAT_00904b80;
              iVar71 = auVar53._4_4_;
              auVar113._4_4_ = iVar71;
              auVar113._0_4_ = iVar71;
              auVar113._8_4_ = auVar53._12_4_;
              auVar113._12_4_ = auVar53._12_4_;
              iVar82 = iVar32 - auVar53._0_4_ * gap;
              iVar84 = iVar32 - iVar71 * gap;
              iVar117 = iVar32 - (int)((auVar53._8_8_ & 0xffffffff) * (ulong)(uint)gap);
              iVar118 = iVar32 - (int)((auVar113._8_8_ & 0xffffffff) * (ulong)(uint)gap);
              bVar22 = -(-0x80 < iVar82);
              bVar79 = -(-0x80 < iVar84);
              bVar81 = -(-0x80 < iVar117);
              bVar83 = -(-0x80 < iVar118);
              auVar53 = (auVar131 | _DAT_00904b70) ^ auVar51;
              auVar122._0_4_ = -(uint)(iVar102 < auVar53._0_4_);
              auVar122._4_4_ = -(uint)(iVar105 < auVar53._4_4_);
              auVar122._8_4_ = -(uint)(iVar106 < auVar53._8_4_);
              auVar122._12_4_ = -(uint)(iVar107 < auVar53._12_4_);
              auVar136._4_4_ = auVar122._0_4_;
              auVar136._0_4_ = auVar122._0_4_;
              auVar136._8_4_ = auVar122._8_4_;
              auVar136._12_4_ = auVar122._8_4_;
              auVar103 = pshuflw(auVar127,auVar136,0xe8);
              iVar71 = -(uint)(auVar53._4_4_ == iVar105);
              iVar80 = -(uint)(auVar53._12_4_ == iVar107);
              auVar114._4_4_ = iVar71;
              auVar114._0_4_ = iVar71;
              auVar114._8_4_ = iVar80;
              auVar114._12_4_ = iVar80;
              auVar127 = pshuflw(auVar124,auVar114,0xe8);
              auVar57._4_4_ = auVar122._4_4_;
              auVar57._0_4_ = auVar122._4_4_;
              auVar57._8_4_ = auVar122._12_4_;
              auVar57._12_4_ = auVar122._12_4_;
              auVar53 = pshuflw(auVar122,auVar57,0xe8);
              auVar128._8_4_ = 0xffffffff;
              auVar128._0_8_ = 0xffffffffffffffff;
              auVar128._12_4_ = 0xffffffff;
              auVar53 = (auVar53 | auVar127 & auVar103) ^ auVar128;
              auVar53 = packssdw(auVar53,auVar53);
              auVar53 = packsswb(auVar53,auVar53);
              if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                bVar22 = ~bVar22 & 0x80 | (byte)iVar82 & bVar22;
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 9] = bVar22;
              }
              auVar53 = auVar114 & auVar136 | auVar57;
              auVar53 = packssdw(auVar53,auVar53);
              auVar53 = packssdw(auVar53 ^ auVar128,auVar53 ^ auVar128);
              auVar53 = packsswb(auVar57,auVar53);
              if ((auVar53._8_2_ >> 8 & 1) != 0) {
                bVar22 = ~bVar79 & 0x80 | (byte)iVar84 & bVar79;
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 10] = bVar22;
              }
              auVar53 = (auVar131 | _DAT_00904b60) ^ auVar51;
              auVar123._0_4_ = -(uint)(iVar102 < auVar53._0_4_);
              auVar123._4_4_ = -(uint)(iVar105 < auVar53._4_4_);
              auVar123._8_4_ = -(uint)(iVar106 < auVar53._8_4_);
              auVar123._12_4_ = -(uint)(iVar107 < auVar53._12_4_);
              auVar115._4_4_ = auVar123._0_4_;
              auVar115._0_4_ = auVar123._0_4_;
              auVar115._8_4_ = auVar123._8_4_;
              auVar115._12_4_ = auVar123._8_4_;
              auVar58._4_4_ = -(uint)(auVar53._4_4_ == iVar105);
              auVar58._12_4_ = -(uint)(auVar53._12_4_ == iVar107);
              auVar58._0_4_ = auVar58._4_4_;
              auVar58._8_4_ = auVar58._12_4_;
              auVar137._4_4_ = auVar123._4_4_;
              auVar137._0_4_ = auVar123._4_4_;
              auVar137._8_4_ = auVar123._12_4_;
              auVar137._12_4_ = auVar123._12_4_;
              auVar53 = packssdw(auVar123,auVar58 & auVar115 | auVar137);
              auVar129._8_4_ = 0xffffffff;
              auVar129._0_8_ = 0xffffffffffffffff;
              auVar129._12_4_ = 0xffffffff;
              auVar53 = packssdw(auVar53 ^ auVar129,auVar53 ^ auVar129);
              auVar53 = packsswb(auVar53,auVar53);
              if ((auVar53 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                bVar22 = ~bVar81 & 0x80 | (byte)iVar117 & bVar81;
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 0xb] = bVar22;
              }
              auVar127 = pshufhw(auVar115,auVar115,0x84);
              auVar103 = pshufhw(auVar58,auVar58,0x84);
              auVar109 = pshufhw(auVar127,auVar137,0x84);
              auVar109 = (auVar109 | auVar103 & auVar127) ^ auVar129;
              auVar109 = packssdw(auVar109,auVar109);
              auVar103 = packsswb(auVar103 & auVar127,auVar109);
              if ((auVar103._10_2_ >> 8 & 1) != 0) {
                bVar22 = ~bVar83 & 0x80 | (byte)iVar118 & bVar83;
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 0xc] = bVar22;
              }
              auVar72 = auVar72 | _DAT_00904b90;
              iVar71 = auVar72._4_4_;
              auVar97._4_4_ = iVar71;
              auVar97._0_4_ = iVar71;
              auVar97._8_4_ = auVar72._12_4_;
              auVar97._12_4_ = auVar72._12_4_;
              iVar82 = iVar32 - auVar72._0_4_ * gap;
              iVar84 = iVar32 - iVar71 * gap;
              iVar117 = iVar32 - (int)((auVar72._8_8_ & 0xffffffff) * (ulong)(uint)gap);
              iVar118 = iVar32 - (int)((auVar97._8_8_ & 0xffffffff) * (ulong)(uint)gap);
              bVar22 = -(-0x80 < iVar82);
              bVar79 = -(-0x80 < iVar84);
              bVar81 = -(-0x80 < iVar117);
              bVar83 = -(-0x80 < iVar118);
              auVar103 = (auVar131 | _DAT_00904b50) ^ auVar51;
              auVar116._0_4_ = -(uint)(iVar102 < auVar103._0_4_);
              auVar116._4_4_ = -(uint)(iVar105 < auVar103._4_4_);
              auVar116._8_4_ = -(uint)(iVar106 < auVar103._8_4_);
              auVar116._12_4_ = -(uint)(iVar107 < auVar103._12_4_);
              auVar98._4_4_ = auVar116._0_4_;
              auVar98._0_4_ = auVar116._0_4_;
              auVar98._8_4_ = auVar116._8_4_;
              auVar98._12_4_ = auVar116._8_4_;
              auVar109 = pshuflw(auVar53,auVar98,0xe8);
              iVar71 = -(uint)(auVar103._4_4_ == iVar105);
              iVar80 = -(uint)(auVar103._12_4_ == iVar107);
              auVar87._4_4_ = iVar71;
              auVar87._0_4_ = iVar71;
              auVar87._8_4_ = iVar80;
              auVar87._12_4_ = iVar80;
              auVar103 = pshuflw(auVar129,auVar87,0xe8);
              auVar59._4_4_ = auVar116._4_4_;
              auVar59._0_4_ = auVar116._4_4_;
              auVar59._8_4_ = auVar116._12_4_;
              auVar59._12_4_ = auVar116._12_4_;
              auVar53 = pshuflw(auVar116,auVar59,0xe8);
              auVar127._8_4_ = 0xffffffff;
              auVar127._0_8_ = 0xffffffffffffffff;
              auVar127._12_4_ = 0xffffffff;
              auVar53 = (auVar53 | auVar103 & auVar109) ^ auVar127;
              auVar53 = packssdw(auVar53,auVar53);
              in_XMM9 = packsswb(auVar53,auVar53);
              if ((in_XMM9 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                bVar22 = ~bVar22 & 0x80 | (byte)iVar82 & bVar22;
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 0xd] = bVar22;
              }
              auVar53 = auVar87 & auVar98 | auVar59;
              auVar53 = packssdw(auVar53,auVar53);
              auVar53 = packssdw(auVar59,auVar53 ^ auVar127);
              auVar53 = packsswb(auVar53,auVar53);
              if ((auVar53._12_2_ >> 8 & 1) != 0) {
                bVar22 = ~bVar79 & 0x80 | (byte)iVar84 & bVar79;
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 0xe] = bVar22;
              }
              auVar53 = (auVar131 | _DAT_00904b40) ^ auVar51;
              iVar71 = -(uint)(iVar102 < auVar53._0_4_);
              auVar99._4_4_ = -(uint)(iVar105 < auVar53._4_4_);
              iVar80 = -(uint)(iVar106 < auVar53._8_4_);
              auVar99._12_4_ = -(uint)(iVar107 < auVar53._12_4_);
              auVar88._4_4_ = iVar71;
              auVar88._0_4_ = iVar71;
              auVar88._8_4_ = iVar80;
              auVar88._12_4_ = iVar80;
              iVar71 = -(uint)(auVar53._4_4_ == iVar105);
              iVar80 = -(uint)(auVar53._12_4_ == iVar107);
              auVar60._4_4_ = iVar71;
              auVar60._0_4_ = iVar71;
              auVar60._8_4_ = iVar80;
              auVar60._12_4_ = iVar80;
              auVar99._0_4_ = auVar99._4_4_;
              auVar99._8_4_ = auVar99._12_4_;
              auVar53 = auVar60 & auVar88 | auVar99;
              auVar53 = packssdw(auVar53,auVar53);
              auVar53 = packssdw(auVar53 ^ auVar127,auVar53 ^ auVar127);
              auVar53 = packsswb(auVar53,auVar53);
              if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                bVar22 = ~bVar81 & 0x80 | (byte)iVar117 & bVar81;
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 0xf] = bVar22;
              }
              auVar103 = pshufhw(auVar88,auVar88,0x84);
              auVar53 = pshufhw(auVar60,auVar60,0x84);
              auVar109 = pshufhw(auVar103,auVar99,0x84);
              auVar53 = packssdw(auVar53 & auVar103,(auVar109 | auVar53 & auVar103) ^ auVar127);
              auVar53 = packsswb(auVar53,auVar53);
              if ((auVar53._14_2_ >> 8 & 1) != 0) {
                bVar22 = ~bVar83 & 0x80 | (byte)iVar118 & bVar83;
                if (s2_beg != 0) {
                  bVar22 = bVar21;
                }
                ptr_00[uVar41 + 0x10] = bVar22;
              }
              uVar41 = uVar41 + 0x10;
              iVar34 = iVar34 + gap * -0x10;
              iVar39 = iVar39 + gap * 0x10;
            } while ((s2Len + 0xfU & 0xfffffff0) != uVar41);
            alVar73 = (__m128i)psubsb((undefined1  [16])0x0,auVar70);
            uVar46 = (uint)size;
            palVar26 = ptr_03 + (uVar46 - 1);
            auVar68._4_4_ = uVar45;
            auVar68._0_4_ = uVar45;
            auVar68._8_4_ = uVar45;
            auVar68._12_4_ = uVar45;
            uVar41 = size;
            do {
              *palVar26 = alVar73;
              auVar51 = _DAT_00904bb0;
              auVar16._4_4_ = uVar43;
              auVar16._0_4_ = uVar43;
              auVar16._8_4_ = uVar43;
              auVar16._12_4_ = uVar43;
              alVar73 = (__m128i)psubsb((undefined1  [16])alVar73,auVar16);
              auVar61[0] = -((char)alVar73[0] < auVar68[0]);
              auVar61[1] = -(alVar73[0]._1_1_ < auVar68[1]);
              auVar61[2] = -(alVar73[0]._2_1_ < auVar68[2]);
              auVar61[3] = -(alVar73[0]._3_1_ < auVar68[3]);
              auVar61[4] = -(alVar73[0]._4_1_ < auVar68[4]);
              auVar61[5] = -(alVar73[0]._5_1_ < auVar68[5]);
              auVar61[6] = -(alVar73[0]._6_1_ < auVar68[6]);
              auVar61[7] = -(alVar73[0]._7_1_ < auVar68[7]);
              auVar61[8] = -((char)alVar73[1] < auVar68[8]);
              auVar61[9] = -(alVar73[1]._1_1_ < auVar68[9]);
              auVar61[10] = -(alVar73[1]._2_1_ < auVar68[10]);
              auVar61[0xb] = -(alVar73[1]._3_1_ < auVar68[0xb]);
              auVar61[0xc] = -(alVar73[1]._4_1_ < auVar68[0xc]);
              auVar61[0xd] = -(alVar73[1]._5_1_ < auVar68[0xd]);
              auVar61[0xe] = -(alVar73[1]._6_1_ < auVar68[0xe]);
              auVar61[0xf] = -(alVar73[1]._7_1_ < auVar68[0xf]);
              auVar68 = ~auVar61 & auVar68 | (undefined1  [16])alVar73 & auVar61;
              palVar26 = palVar26 + -1;
              iVar32 = (int)uVar41;
              uVar29 = iVar32 - 1;
              uVar41 = (ulong)uVar29;
            } while (uVar29 != 0 && 0 < iVar32);
            lVar30 = size * uVar35;
            auVar19._4_4_ = uVar44;
            auVar19._0_4_ = uVar44;
            auVar19._8_4_ = uVar44;
            auVar19._12_4_ = uVar44;
            local_170 = 0;
            uVar41 = 0;
            auVar53 = auVar19;
            auVar103 = auVar19;
            iVar32 = iVar27;
            do {
              uVar1 = ptr_02[uVar46 - 1][0];
              auVar62._0_8_ = uVar1 << 8;
              auVar62._8_8_ = ptr_02[uVar46 - 1][1] << 8 | uVar1 >> 0x38;
              iVar34 = ppVar14->mapper[(byte)s2[uVar41]];
              auVar124 = psubsb(auVar19,(undefined1  [16])*ptr_03);
              lVar36 = 0;
              auVar74 = ~auVar51 & ZEXT116((byte)ptr_00[uVar41]) | auVar62;
              auVar127 = auVar19;
              do {
                auVar109 = *(undefined1 (*) [16])((long)*ptr_02 + lVar36);
                auVar17._4_4_ = uVar43;
                auVar17._0_4_ = uVar43;
                auVar17._8_4_ = uVar43;
                auVar17._12_4_ = uVar43;
                auVar121 = psubsb(*(undefined1 (*) [16])((long)*ptr + lVar36),auVar17);
                auVar85 = psubsb(auVar109,auVar70);
                auVar132[0] = -(auVar85[0] < auVar121[0]);
                auVar132[1] = -(auVar85[1] < auVar121[1]);
                auVar132[2] = -(auVar85[2] < auVar121[2]);
                auVar132[3] = -(auVar85[3] < auVar121[3]);
                auVar132[4] = -(auVar85[4] < auVar121[4]);
                auVar132[5] = -(auVar85[5] < auVar121[5]);
                auVar132[6] = -(auVar85[6] < auVar121[6]);
                auVar132[7] = -(auVar85[7] < auVar121[7]);
                auVar132[8] = -(auVar85[8] < auVar121[8]);
                auVar132[9] = -(auVar85[9] < auVar121[9]);
                auVar132[10] = -(auVar85[10] < auVar121[10]);
                auVar132[0xb] = -(auVar85[0xb] < auVar121[0xb]);
                auVar132[0xc] = -(auVar85[0xc] < auVar121[0xc]);
                auVar132[0xd] = -(auVar85[0xd] < auVar121[0xd]);
                auVar132[0xe] = -(auVar85[0xe] < auVar121[0xe]);
                auVar132[0xf] = -(auVar85[0xf] < auVar121[0xf]);
                auVar121 = ~auVar132 & auVar85 | auVar121 & auVar132;
                auVar74 = paddsb(auVar74,*(undefined1 (*) [16])
                                          ((long)pvVar13 + lVar36 + size * (long)iVar34 * 0x10));
                auVar124 = paddsb(auVar124,*(undefined1 (*) [16])((long)*ptr_03 + lVar36));
                auVar89[0] = -(auVar124[0] < auVar127[0]);
                auVar89[1] = -(auVar124[1] < auVar127[1]);
                auVar89[2] = -(auVar124[2] < auVar127[2]);
                auVar89[3] = -(auVar124[3] < auVar127[3]);
                auVar89[4] = -(auVar124[4] < auVar127[4]);
                auVar89[5] = -(auVar124[5] < auVar127[5]);
                auVar89[6] = -(auVar124[6] < auVar127[6]);
                auVar89[7] = -(auVar124[7] < auVar127[7]);
                auVar89[8] = -(auVar124[8] < auVar127[8]);
                auVar89[9] = -(auVar124[9] < auVar127[9]);
                auVar89[10] = -(auVar124[10] < auVar127[10]);
                auVar89[0xb] = -(auVar124[0xb] < auVar127[0xb]);
                auVar89[0xc] = -(auVar124[0xc] < auVar127[0xc]);
                auVar89[0xd] = -(auVar124[0xd] < auVar127[0xd]);
                auVar89[0xe] = -(auVar124[0xe] < auVar127[0xe]);
                auVar89[0xf] = -(auVar124[0xf] < auVar127[0xf]);
                auVar127 = ~auVar89 & auVar124 | auVar127 & auVar89;
                auVar125[0] = -(auVar74[0] < auVar121[0]);
                auVar125[1] = -(auVar74[1] < auVar121[1]);
                auVar125[2] = -(auVar74[2] < auVar121[2]);
                auVar125[3] = -(auVar74[3] < auVar121[3]);
                auVar125[4] = -(auVar74[4] < auVar121[4]);
                auVar125[5] = -(auVar74[5] < auVar121[5]);
                auVar125[6] = -(auVar74[6] < auVar121[6]);
                auVar125[7] = -(auVar74[7] < auVar121[7]);
                auVar125[8] = -(auVar74[8] < auVar121[8]);
                auVar125[9] = -(auVar74[9] < auVar121[9]);
                auVar125[10] = -(auVar74[10] < auVar121[10]);
                auVar125[0xb] = -(auVar74[0xb] < auVar121[0xb]);
                auVar125[0xc] = -(auVar74[0xc] < auVar121[0xc]);
                auVar125[0xd] = -(auVar74[0xd] < auVar121[0xd]);
                auVar125[0xe] = -(auVar74[0xe] < auVar121[0xe]);
                auVar125[0xf] = -(auVar74[0xf] < auVar121[0xf]);
                *(undefined1 (*) [16])((long)*ptr + lVar36) = auVar121;
                auVar124 = ~auVar125 & auVar74 | auVar121 & auVar125;
                *(undefined1 (*) [16])((long)*ptr_01 + lVar36) = auVar124;
                lVar36 = lVar36 + 0x10;
                auVar74 = auVar109;
              } while (size << 4 != lVar36);
              auVar130._0_8_ = auVar124._0_8_ << 8;
              auVar130._8_8_ = auVar124._8_8_ << 8 | auVar124._0_8_ >> 0x38;
              uVar1 = uVar41 + 1;
              auVar130 = ~auVar51 & ZEXT116((byte)ptr_00[uVar41 + 1]) | auVar130;
              auVar74 = paddsb((undefined1  [16])*ptr_03,auVar130);
              auVar75[0] = -(auVar74[0] < auVar127[0]);
              auVar75[1] = -(auVar74[1] < auVar127[1]);
              auVar75[2] = -(auVar74[2] < auVar127[2]);
              auVar75[3] = -(auVar74[3] < auVar127[3]);
              auVar75[4] = -(auVar74[4] < auVar127[4]);
              auVar75[5] = -(auVar74[5] < auVar127[5]);
              auVar75[6] = -(auVar74[6] < auVar127[6]);
              auVar75[7] = -(auVar74[7] < auVar127[7]);
              auVar75[8] = -(auVar74[8] < auVar127[8]);
              auVar75[9] = -(auVar74[9] < auVar127[9]);
              auVar75[10] = -(auVar74[10] < auVar127[10]);
              auVar75[0xb] = -(auVar74[0xb] < auVar127[0xb]);
              auVar75[0xc] = -(auVar74[0xc] < auVar127[0xc]);
              auVar75[0xd] = -(auVar74[0xd] < auVar127[0xd]);
              auVar75[0xe] = -(auVar74[0xe] < auVar127[0xe]);
              auVar75[0xf] = -(auVar74[0xf] < auVar127[0xf]);
              auVar74 = ~auVar75 & auVar74 | auVar127 & auVar75;
              iVar34 = 0xe;
              do {
                auVar76._0_8_ = auVar74._0_8_ << 8;
                auVar76._8_8_ = auVar74._8_8_ << 8 | auVar74._0_8_ >> 0x38;
                auVar127 = paddsb(auVar76,auVar52);
                auVar63[0] = -(auVar127[0] < auVar74[0]);
                auVar63[1] = -(auVar127[1] < auVar74[1]);
                auVar63[2] = -(auVar127[2] < auVar74[2]);
                auVar63[3] = -(auVar127[3] < auVar74[3]);
                auVar63[4] = -(auVar127[4] < auVar74[4]);
                auVar63[5] = -(auVar127[5] < auVar74[5]);
                auVar63[6] = -(auVar127[6] < auVar74[6]);
                auVar63[7] = -(auVar127[7] < auVar74[7]);
                auVar63[8] = -(auVar127[8] < auVar74[8]);
                auVar63[9] = -(auVar127[9] < auVar74[9]);
                auVar63[10] = -(auVar127[10] < auVar74[10]);
                auVar63[0xb] = -(auVar127[0xb] < auVar74[0xb]);
                auVar63[0xc] = -(auVar127[0xc] < auVar74[0xc]);
                auVar63[0xd] = -(auVar127[0xd] < auVar74[0xd]);
                auVar63[0xe] = -(auVar127[0xe] < auVar74[0xe]);
                auVar63[0xf] = -(auVar127[0xf] < auVar74[0xf]);
                auVar74 = ~auVar63 & auVar127 | auVar74 & auVar63;
                iVar34 = iVar34 + -1;
              } while (iVar34 != 0);
              auVar77._0_8_ = auVar74._0_8_ << 8;
              auVar77._8_8_ = auVar74._8_8_ << 8 | auVar74._0_8_ >> 0x38;
              auVar74 = paddsb(auVar77,ZEXT116(bVar42));
              auVar90[0] = -(auVar74[0] < auVar130[0]);
              auVar90[1] = -(auVar74[1] < auVar130[1]);
              auVar90[2] = -(auVar74[2] < auVar130[2]);
              auVar90[3] = -(auVar74[3] < auVar130[3]);
              auVar90[4] = -(auVar74[4] < auVar130[4]);
              auVar90[5] = -(auVar74[5] < auVar130[5]);
              auVar90[6] = -(auVar74[6] < auVar130[6]);
              auVar90[7] = -(auVar74[7] < auVar130[7]);
              auVar90[8] = -(auVar74[8] < auVar130[8]);
              auVar90[9] = -(auVar74[9] < auVar130[9]);
              auVar90[10] = -(auVar74[10] < auVar130[10]);
              auVar90[0xb] = -(auVar74[0xb] < auVar130[0xb]);
              auVar90[0xc] = -(auVar74[0xc] < auVar130[0xc]);
              auVar90[0xd] = -(auVar74[0xd] < auVar130[0xd]);
              auVar90[0xe] = -(auVar74[0xe] < auVar130[0xe]);
              auVar90[0xf] = -(auVar74[0xf] < auVar130[0xf]);
              auVar127 = ~auVar90 & auVar74 | auVar130 & auVar90;
              lVar37 = 0;
              lVar36 = local_170;
              do {
                auVar124 = *(undefined1 (*) [16])((long)*ptr_01 + lVar37);
                auVar18._4_4_ = uVar43;
                auVar18._0_4_ = uVar43;
                auVar18._8_4_ = uVar43;
                auVar18._12_4_ = uVar43;
                auVar74 = psubsb(auVar74,auVar18);
                auVar127 = psubsb(auVar127,auVar70);
                auVar126[0] = -(auVar127[0] < auVar74[0]);
                auVar126[1] = -(auVar127[1] < auVar74[1]);
                auVar126[2] = -(auVar127[2] < auVar74[2]);
                auVar126[3] = -(auVar127[3] < auVar74[3]);
                auVar126[4] = -(auVar127[4] < auVar74[4]);
                auVar126[5] = -(auVar127[5] < auVar74[5]);
                auVar126[6] = -(auVar127[6] < auVar74[6]);
                auVar126[7] = -(auVar127[7] < auVar74[7]);
                auVar126[8] = -(auVar127[8] < auVar74[8]);
                auVar126[9] = -(auVar127[9] < auVar74[9]);
                auVar126[10] = -(auVar127[10] < auVar74[10]);
                auVar126[0xb] = -(auVar127[0xb] < auVar74[0xb]);
                auVar126[0xc] = -(auVar127[0xc] < auVar74[0xc]);
                auVar126[0xd] = -(auVar127[0xd] < auVar74[0xd]);
                auVar126[0xe] = -(auVar127[0xe] < auVar74[0xe]);
                auVar126[0xf] = -(auVar127[0xf] < auVar74[0xf]);
                auVar74 = auVar74 & auVar126 | ~auVar126 & auVar127;
                auVar91[0] = -(auVar74[0] < auVar124[0]);
                auVar91[1] = -(auVar74[1] < auVar124[1]);
                auVar91[2] = -(auVar74[2] < auVar124[2]);
                auVar91[3] = -(auVar74[3] < auVar124[3]);
                auVar91[4] = -(auVar74[4] < auVar124[4]);
                auVar91[5] = -(auVar74[5] < auVar124[5]);
                auVar91[6] = -(auVar74[6] < auVar124[6]);
                auVar91[7] = -(auVar74[7] < auVar124[7]);
                auVar91[8] = -(auVar74[8] < auVar124[8]);
                auVar91[9] = -(auVar74[9] < auVar124[9]);
                auVar91[10] = -(auVar74[10] < auVar124[10]);
                auVar91[0xb] = -(auVar74[0xb] < auVar124[0xb]);
                auVar91[0xc] = -(auVar74[0xc] < auVar124[0xc]);
                auVar91[0xd] = -(auVar74[0xd] < auVar124[0xd]);
                auVar91[0xe] = -(auVar74[0xe] < auVar124[0xe]);
                auVar91[0xf] = -(auVar74[0xf] < auVar124[0xf]);
                auVar127 = ~auVar91 & auVar74 | auVar124 & auVar91;
                *(undefined1 (*) [16])((long)*ptr_02 + lVar37) = auVar127;
                piVar15 = ((ppVar25->field_4).rowcols)->score_row;
                cVar20 = *(char *)((long)*ptr_02 + lVar37 + 1);
                cVar133 = *(char *)((long)*ptr_02 + lVar37 + 2);
                cVar139 = *(char *)((long)*ptr_02 + lVar37 + 3);
                cVar140 = *(char *)((long)*ptr_02 + lVar37 + 4);
                cVar141 = *(char *)((long)*ptr_02 + lVar37 + 5);
                cVar2 = *(char *)((long)*ptr_02 + lVar37 + 6);
                cVar3 = *(char *)((long)*ptr_02 + lVar37 + 7);
                cVar4 = *(char *)((long)*ptr_02 + lVar37 + 8);
                cVar5 = *(char *)((long)*ptr_02 + lVar37 + 9);
                cVar6 = *(char *)((long)*ptr_02 + lVar37 + 10);
                cVar7 = *(char *)((long)*ptr_02 + lVar37 + 0xb);
                cVar8 = *(char *)((long)*ptr_02 + lVar37 + 0xc);
                cVar9 = *(char *)((long)*ptr_02 + lVar37 + 0xd);
                cVar10 = *(char *)((long)*ptr_02 + lVar37 + 0xe);
                cVar11 = *(char *)((long)*ptr_02 + lVar37 + 0xf);
                *(int *)((long)piVar15 + lVar36) = (int)*(char *)((long)*ptr_02 + lVar37);
                *(int *)((long)piVar15 + lVar30 * 4 + lVar36) = (int)cVar20;
                *(int *)((long)piVar15 + lVar30 * 8 + lVar36) = (int)cVar133;
                *(int *)((long)piVar15 + lVar30 * 0xc + lVar36) = (int)cVar139;
                *(int *)((long)piVar15 + lVar30 * 0x10 + lVar36) = (int)cVar140;
                *(int *)((long)piVar15 + lVar30 * 0x14 + lVar36) = (int)cVar141;
                *(int *)((long)piVar15 + lVar30 * 0x18 + lVar36) = (int)cVar2;
                *(int *)((long)piVar15 + lVar30 * 0x1c + lVar36) = (int)cVar3;
                *(int *)((long)piVar15 + lVar30 * 0x20 + lVar36) = (int)cVar4;
                *(int *)((long)piVar15 + lVar30 * 0x24 + lVar36) = (int)cVar5;
                *(int *)((long)piVar15 + lVar30 * 0x28 + lVar36) = (int)cVar6;
                *(int *)((long)piVar15 + lVar30 * 0x2c + lVar36) = (int)cVar7;
                *(int *)((long)piVar15 + lVar30 * 0x30 + lVar36) = (int)cVar8;
                *(int *)((long)piVar15 + lVar30 * 0x34 + lVar36) = (int)cVar9;
                *(int *)((long)piVar15 + lVar30 * 0x38 + lVar36) = (int)cVar10;
                *(int *)((long)piVar15 + lVar30 * 0x3c + lVar36) = (int)cVar11;
                auVar64[0] = -(auVar127[0] < auVar68[0]);
                auVar64[1] = -(auVar127[1] < auVar68[1]);
                auVar64[2] = -(auVar127[2] < auVar68[2]);
                auVar64[3] = -(auVar127[3] < auVar68[3]);
                auVar64[4] = -(auVar127[4] < auVar68[4]);
                auVar64[5] = -(auVar127[5] < auVar68[5]);
                auVar64[6] = -(auVar127[6] < auVar68[6]);
                auVar64[7] = -(auVar127[7] < auVar68[7]);
                auVar64[8] = -(auVar127[8] < auVar68[8]);
                auVar64[9] = -(auVar127[9] < auVar68[9]);
                auVar64[10] = -(auVar127[10] < auVar68[10]);
                auVar64[0xb] = -(auVar127[0xb] < auVar68[0xb]);
                auVar64[0xc] = -(auVar127[0xc] < auVar68[0xc]);
                auVar64[0xd] = -(auVar127[0xd] < auVar68[0xd]);
                auVar64[0xe] = -(auVar127[0xe] < auVar68[0xe]);
                auVar64[0xf] = -(auVar127[0xf] < auVar68[0xf]);
                auVar124 = ~auVar64 & auVar68 | auVar127 & auVar64;
                auVar69[0] = -(auVar74[0] < auVar124[0]);
                auVar69[1] = -(auVar74[1] < auVar124[1]);
                auVar69[2] = -(auVar74[2] < auVar124[2]);
                auVar69[3] = -(auVar74[3] < auVar124[3]);
                auVar69[4] = -(auVar74[4] < auVar124[4]);
                auVar69[5] = -(auVar74[5] < auVar124[5]);
                auVar69[6] = -(auVar74[6] < auVar124[6]);
                auVar69[7] = -(auVar74[7] < auVar124[7]);
                auVar69[8] = -(auVar74[8] < auVar124[8]);
                auVar69[9] = -(auVar74[9] < auVar124[9]);
                auVar69[10] = -(auVar74[10] < auVar124[10]);
                auVar69[0xb] = -(auVar74[0xb] < auVar124[0xb]);
                auVar69[0xc] = -(auVar74[0xc] < auVar124[0xc]);
                auVar69[0xd] = -(auVar74[0xd] < auVar124[0xd]);
                auVar69[0xe] = -(auVar74[0xe] < auVar124[0xe]);
                auVar69[0xf] = -(auVar74[0xf] < auVar124[0xf]);
                auVar68 = ~auVar69 & auVar124 | auVar74 & auVar69;
                auVar100[0] = -(auVar127[0] < auVar53[0]);
                auVar100[1] = -(auVar127[1] < auVar53[1]);
                auVar100[2] = -(auVar127[2] < auVar53[2]);
                auVar100[3] = -(auVar127[3] < auVar53[3]);
                auVar100[4] = -(auVar127[4] < auVar53[4]);
                auVar100[5] = -(auVar127[5] < auVar53[5]);
                auVar100[6] = -(auVar127[6] < auVar53[6]);
                auVar100[7] = -(auVar127[7] < auVar53[7]);
                auVar100[8] = -(auVar127[8] < auVar53[8]);
                auVar100[9] = -(auVar127[9] < auVar53[9]);
                auVar100[10] = -(auVar127[10] < auVar53[10]);
                auVar100[0xb] = -(auVar127[0xb] < auVar53[0xb]);
                auVar100[0xc] = -(auVar127[0xc] < auVar53[0xc]);
                auVar100[0xd] = -(auVar127[0xd] < auVar53[0xd]);
                auVar100[0xe] = -(auVar127[0xe] < auVar53[0xe]);
                auVar100[0xf] = -(auVar127[0xf] < auVar53[0xf]);
                auVar53 = ~auVar100 & auVar127 | auVar53 & auVar100;
                lVar37 = lVar37 + 0x10;
                lVar36 = lVar36 + uVar35 * 4;
              } while (size << 4 != lVar37);
              alVar73 = ptr_02[uVar48];
              auVar78[0] = -(auVar103[0] < (char)alVar73[0]);
              auVar78[1] = -(auVar103[1] < alVar73[0]._1_1_);
              auVar78[2] = -(auVar103[2] < alVar73[0]._2_1_);
              auVar78[3] = -(auVar103[3] < alVar73[0]._3_1_);
              auVar78[4] = -(auVar103[4] < alVar73[0]._4_1_);
              auVar78[5] = -(auVar103[5] < alVar73[0]._5_1_);
              auVar78[6] = -(auVar103[6] < alVar73[0]._6_1_);
              auVar78[7] = -(auVar103[7] < alVar73[0]._7_1_);
              auVar78[8] = -(auVar103[8] < (char)alVar73[1]);
              auVar78[9] = -(auVar103[9] < alVar73[1]._1_1_);
              auVar78[10] = -(auVar103[10] < alVar73[1]._2_1_);
              auVar78[0xb] = -(auVar103[0xb] < alVar73[1]._3_1_);
              auVar78[0xc] = -(auVar103[0xc] < alVar73[1]._4_1_);
              auVar78[0xd] = -(auVar103[0xd] < alVar73[1]._5_1_);
              auVar78[0xe] = -(auVar103[0xe] < alVar73[1]._6_1_);
              auVar78[0xf] = -(auVar103[0xf] < alVar73[1]._7_1_);
              auVar92[1] = -(cStack_157 == '\x0e');
              auVar92[0] = -(local_158 == '\x0f');
              auVar92[2] = -(cStack_156 == '\r');
              auVar92[3] = -(cStack_155 == '\f');
              auVar92[4] = -(local_158 == '\v');
              auVar92[5] = -(cStack_157 == '\n');
              auVar92[6] = -(cStack_156 == '\t');
              auVar92[7] = -(cStack_155 == '\b');
              auVar92[8] = -(local_158 == '\a');
              auVar92[9] = -(cStack_157 == '\x06');
              auVar92[10] = -(cStack_156 == '\x05');
              auVar92[0xb] = -(cStack_155 == '\x04');
              auVar92[0xc] = -(local_158 == '\x03');
              auVar92[0xd] = -(cStack_157 == '\x02');
              auVar92[0xe] = -(cStack_156 == '\x01');
              auVar92[0xf] = -(cStack_155 == '\0');
              auVar92 = auVar78 & auVar92;
              local_168 = (int)uVar41;
              if ((((((((((((((((auVar92 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar92 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar92 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar92 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar92 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar92 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar92 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar92 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar92 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar92 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar92 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar92 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar92[0xf] < '\0') {
                iVar32 = local_168;
              }
              auVar103 = ~auVar78 & auVar103 | (undefined1  [16])alVar73 & auVar78;
              uVar108 = auVar103._14_2_;
              local_170 = local_170 + 4;
              uVar41 = uVar1;
            } while (uVar1 != uVar35);
            if (s2_end != 0) {
              if (iVar24 < 0xf) {
                iVar34 = 0;
                do {
                  auVar104._0_8_ = auVar103._0_8_ << 8;
                  auVar104._8_8_ = auVar103._8_8_ << 8 | auVar103._0_8_ >> 0x38;
                  uVar108 = auVar103._13_2_;
                  iVar34 = iVar34 + 1;
                  auVar103 = auVar104;
                } while (iVar34 < iVar28);
              }
              uVar38 = uVar108 >> 8;
            }
            cVar20 = (char)uVar38;
            uVar29 = uVar23;
            if ((s1_end != 0) && ((uVar31 & 0x7ffffff0) != 0)) {
              uVar31 = 0;
              do {
                uVar33 = ((uint)uVar31 & 0xf) * uVar46 + ((uint)(uVar31 >> 4) & 0xfffffff);
                if ((int)uVar33 < (int)uVar12) {
                  bVar42 = *(byte *)((long)*ptr_02 + uVar31);
                  if ((char)(byte)uVar38 < (char)bVar42) {
                    uVar38 = (ushort)bVar42;
                    iVar32 = iVar27;
                    uVar29 = uVar33;
                  }
                  else {
                    if ((int)uVar29 <= (int)uVar33) {
                      uVar33 = uVar29;
                    }
                    if (iVar32 != iVar27) {
                      uVar33 = uVar29;
                    }
                    if (bVar42 == (byte)uVar38) {
                      uVar29 = uVar33;
                    }
                  }
                }
                cVar20 = (char)uVar38;
                uVar31 = uVar31 + 1;
              } while ((uVar46 & 0x7ffffff) << 4 != (int)uVar31);
            }
            if (s2_end == 0 && s1_end == 0) {
              uVar31 = ptr_02[uVar48][1];
              if (iVar24 < 0xf) {
                iVar24 = 0;
                uVar48 = ptr_02[uVar48][0];
                do {
                  uVar31 = uVar31 << 8 | uVar48 >> 0x38;
                  iVar24 = iVar24 + 1;
                  uVar48 = uVar48 << 8;
                } while (iVar24 < iVar28);
              }
              cVar20 = (char)(uVar31 >> 0x38);
              iVar32 = iVar27;
              uVar29 = uVar23;
            }
            cVar133 = auVar49[0];
            auVar138[0] = -(auVar68[0] < cVar133);
            cVar139 = auVar49[1];
            auVar138[1] = -(auVar68[1] < cVar139);
            cVar140 = auVar49[2];
            auVar138[2] = -(auVar68[2] < cVar140);
            cVar141 = auVar49[3];
            auVar138[3] = -(auVar68[3] < cVar141);
            auVar138[4] = -(auVar68[4] < cVar133);
            auVar138[5] = -(auVar68[5] < cVar139);
            auVar138[6] = -(auVar68[6] < cVar140);
            auVar138[7] = -(auVar68[7] < cVar141);
            auVar138[8] = -(auVar68[8] < cVar133);
            auVar138[9] = -(auVar68[9] < cVar139);
            auVar138[10] = -(auVar68[10] < cVar140);
            auVar138[0xb] = -(auVar68[0xb] < cVar141);
            auVar138[0xc] = -(auVar68[0xc] < cVar133);
            auVar138[0xd] = -(auVar68[0xd] < cVar139);
            auVar138[0xe] = -(auVar68[0xe] < cVar140);
            auVar138[0xf] = -(auVar68[0xf] < cVar141);
            cVar133 = auVar50[0];
            auVar101[0] = -(cVar133 < auVar53[0]);
            cVar139 = auVar50[1];
            auVar101[1] = -(cVar139 < auVar53[1]);
            cVar140 = auVar50[2];
            auVar101[2] = -(cVar140 < auVar53[2]);
            cVar141 = auVar50[3];
            auVar101[3] = -(cVar141 < auVar53[3]);
            auVar101[4] = -(cVar133 < auVar53[4]);
            auVar101[5] = -(cVar139 < auVar53[5]);
            auVar101[6] = -(cVar140 < auVar53[6]);
            auVar101[7] = -(cVar141 < auVar53[7]);
            auVar101[8] = -(cVar133 < auVar53[8]);
            auVar101[9] = -(cVar139 < auVar53[9]);
            auVar101[10] = -(cVar140 < auVar53[10]);
            auVar101[0xb] = -(cVar141 < auVar53[0xb]);
            auVar101[0xc] = -(cVar133 < auVar53[0xc]);
            auVar101[0xd] = -(cVar139 < auVar53[0xd]);
            auVar101[0xe] = -(cVar140 < auVar53[0xe]);
            auVar101[0xf] = -(cVar141 < auVar53[0xf]);
            auVar101 = auVar101 | auVar138;
            if ((((((((((((((((auVar101 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar101 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar101 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar101 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar101 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar101 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar101 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar101 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar101 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar101 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar101 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar101 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar101 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar101 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar101 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar101[0xf] < '\0') {
              *(byte *)&ppVar25->flag = (byte)ppVar25->flag | 0x40;
              cVar20 = '\0';
              iVar32 = 0;
              uVar29 = 0;
            }
            ppVar25->score = (int)cVar20;
            ppVar25->end_query = uVar29;
            ppVar25->end_ref = iVar32;
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            return ppVar25;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m128i vZero;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi8_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi8(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi8(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi8(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 1);
        vHp = _mm_insert_epi8_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vE, vGapE),
                    _mm_subs_epi8(vH, vGapO));
            vHp = _mm_adds_epi8(vHp, vW);
            vF = _mm_max_epi8_rpl(vF, _mm_adds_epi8(vHt, pvGapper[i]));
            vHt = _mm_max_epi8_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 1);
        vHt = _mm_insert_epi8_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi8_rpl(vF, _mm_adds_epi8(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 1);
            vFt = _mm_adds_epi8(vFt, vSegLenXgap);
            vF = _mm_max_epi8_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 1);
        vF = _mm_adds_epi8(vF, vNegInfFront);
        vH = _mm_max_epi8_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vF, vGapE),
                    _mm_subs_epi8(vH, vGapO));
            vH = _mm_max_epi8_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm_max_epi8_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8_rpl (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
        }
        score = (int8_t) _mm_extract_epi8_rpl(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            score = (int8_t) _mm_extract_epi8_rpl (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}